

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_generator.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::javanano::JavaNanoGenerator::Generate
          (JavaNanoGenerator *this,FileDescriptor *file,string *parameter,
          GeneratorContext *output_directory,string *error)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  int i;
  ulong uVar6;
  long lVar7;
  allocator local_299;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_files;
  string java_filename;
  string package_dir;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  string output_list_file;
  FileGenerator file_generator;
  string option_name;
  Params params;
  ZeroCopyOutputStream *pZVar4;
  
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ParseGeneratorParameter(parameter,&options);
  output_list_file._M_dataplus._M_p = (pointer)&output_list_file.field_2;
  output_list_file._M_string_length = 0;
  output_list_file.field_2._M_local_buf[0] = '\0';
  Params::Params(&params,*(string **)file);
  UpdateParamsRecursively(&params,file);
  lVar5 = 0;
  uVar6 = 0;
  do {
    if ((ulong)((long)options.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)options.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 6) <= uVar6) {
      if ((params.generate_has_ == true) &&
         ((params.optional_field_accessors_ != false ||
          (params.use_reference_types_for_primitives_ == true)))) {
        std::__cxx11::string::assign((char *)error);
LAB_00250ff6:
        bVar1 = false;
      }
      else {
        FileGenerator::FileGenerator(&file_generator,file,&params);
        bVar1 = FileGenerator::Validate(&file_generator,error);
        if (bVar1) {
          std::__cxx11::string::string((string *)&option_name,".",(allocator *)&all_files);
          std::__cxx11::string::string((string *)&java_filename,"/",&local_299);
          StringReplace(&package_dir,&file_generator.java_package_,&option_name,&java_filename,true)
          ;
          std::__cxx11::string::~string((string *)&java_filename);
          std::__cxx11::string::~string((string *)&option_name);
          if (package_dir._M_string_length != 0) {
            std::__cxx11::string::append((char *)&package_dir);
          }
          all_files.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          all_files.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          all_files.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          bVar2 = IsOuterClassNeeded(&params,file);
          if (bVar2) {
            std::__cxx11::string::string((string *)&java_filename,(string *)&package_dir);
            std::__cxx11::string::append((string *)&java_filename);
            std::__cxx11::string::append((char *)&java_filename);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&all_files,&java_filename);
            iVar3 = (*output_directory->_vptr_GeneratorContext[2])(output_directory,&java_filename);
            pZVar4 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar3);
            io::Printer::Printer((Printer *)&option_name,pZVar4,'$');
            FileGenerator::Generate(&file_generator,(Printer *)&option_name);
            io::Printer::~Printer((Printer *)&option_name);
            if (pZVar4 != (ZeroCopyOutputStream *)0x0) {
              (*pZVar4->_vptr_ZeroCopyOutputStream[1])(pZVar4);
            }
            std::__cxx11::string::~string((string *)&java_filename);
          }
          FileGenerator::GenerateSiblings(&file_generator,&package_dir,output_directory,&all_files);
          if (output_list_file._M_string_length != 0) {
            iVar3 = (*output_directory->_vptr_GeneratorContext[2])
                              (output_directory,&output_list_file);
            pZVar4 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar3);
            io::Printer::Printer((Printer *)&option_name,pZVar4,'$');
            lVar5 = 0;
            for (uVar6 = 0;
                uVar6 < (ulong)((long)all_files.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)all_files.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5);
                uVar6 = uVar6 + 1) {
              io::Printer::Print((Printer *)&option_name,"$filename$\n","filename",
                                 (string *)
                                 ((long)&((all_files.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar5));
              lVar5 = lVar5 + 0x20;
            }
            io::Printer::~Printer((Printer *)&option_name);
            if (pZVar4 != (ZeroCopyOutputStream *)0x0) {
              (*pZVar4->_vptr_ZeroCopyOutputStream[1])();
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&all_files);
          std::__cxx11::string::~string((string *)&package_dir);
        }
        FileGenerator::~FileGenerator(&file_generator);
      }
      Params::~Params(&params);
      std::__cxx11::string::~string((string *)&output_list_file);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&options);
      return bVar1;
    }
    anon_unknown_5::TrimString
              (&option_name,
               (string *)
               ((long)&((options.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus._M_p + lVar5
               ));
    anon_unknown_5::TrimString
              ((string *)&file_generator,
               (string *)
               ((long)&((options.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->second)._M_dataplus._M_p +
               lVar5));
    bVar1 = std::operator==(&option_name,"output_list_file");
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)&output_list_file);
    }
    else {
      bVar1 = std::operator==(&option_name,"java_package");
      if (bVar1) {
        all_files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        all_files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        all_files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        SplitStringUsing((string *)&file_generator,"|",&all_files);
        lVar7 = (long)all_files.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)all_files.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        if (lVar7 == 0x40) {
          Params::set_java_package
                    (&params,all_files.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                     all_files.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
        }
        else {
          std::operator+(&java_filename,"Bad java_package, expecting filename|PackageName found \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &file_generator);
          std::operator+(&package_dir,&java_filename,"\'");
LAB_00250aff:
          std::__cxx11::string::operator=((string *)error,(string *)&package_dir);
          std::__cxx11::string::~string((string *)&package_dir);
          std::__cxx11::string::~string((string *)&java_filename);
        }
      }
      else {
        bVar1 = std::operator==(&option_name,"java_outer_classname");
        if (!bVar1) {
          bVar1 = std::operator==(&option_name,"store_unknown_fields");
          if (bVar1) {
            params.store_unknown_fields_ =
                 std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&file_generator,"true");
          }
          else {
            bVar1 = std::operator==(&option_name,"java_multiple_files");
            if (bVar1) {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&file_generator,"true");
              params.override_java_multiple_files_ = bVar1 + JAVANANO_MUL_FALSE;
            }
            else {
              bVar1 = std::operator==(&option_name,"java_nano_generate_has");
              if (bVar1) {
                params.generate_has_ =
                     std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&file_generator,"true");
              }
              else {
                bVar1 = std::operator==(&option_name,"enum_style");
                if (bVar1) {
                  params.java_enum_style_ =
                       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&file_generator,"java");
                }
                else {
                  bVar1 = std::operator==(&option_name,"optional_field_style");
                  if (bVar1) {
                    params.optional_field_accessors_ =
                         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&file_generator,"accessors");
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&file_generator,"reftypes");
                    bVar2 = true;
                    if (!bVar1) {
                      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)&file_generator,"reftypes_compat_mode");
                    }
                    params.use_reference_types_for_primitives_ = bVar2;
                    params.reftypes_primitive_enums_ =
                         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&file_generator,"reftypes_compat_mode");
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&file_generator,"reftypes_compat_mode");
                    if (bVar1) {
                      params.generate_clear_ = false;
                    }
                  }
                  else {
                    bVar1 = std::operator==(&option_name,"generate_equals");
                    if (bVar1) {
                      params.generate_equals_ =
                           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&file_generator,"true");
                    }
                    else {
                      bVar1 = std::operator==(&option_name,"ignore_services");
                      if (bVar1) {
                        params.ignore_services_ =
                             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&file_generator,"true");
                      }
                      else {
                        bVar1 = std::operator==(&option_name,"parcelable_messages");
                        if (bVar1) {
                          params.parcelable_messages_ =
                               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&file_generator,"true");
                        }
                        else {
                          bVar1 = std::operator==(&option_name,"generate_clone");
                          if (bVar1) {
                            params.generate_clone_ =
                                 std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&file_generator,"true");
                          }
                          else {
                            bVar1 = std::operator==(&option_name,"generate_intdefs");
                            if (bVar1) {
                              params.generate_intdefs_ =
                                   std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&file_generator,"true");
                            }
                            else {
                              bVar1 = std::operator==(&option_name,"generate_clear");
                              if (bVar1) {
                                params.generate_clear_ =
                                     std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&file_generator,"true");
                              }
                              else {
                                std::operator+(&package_dir,
                                               "Ignore unknown javanano generator option: ",
                                               &option_name);
                                std::__cxx11::string::operator=
                                          ((string *)error,(string *)&package_dir);
                                std::__cxx11::string::~string((string *)&package_dir);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          goto LAB_00250b3e;
        }
        all_files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        all_files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        all_files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        SplitStringUsing((string *)&file_generator,"|",&all_files);
        lVar7 = (long)all_files.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)all_files.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        if (lVar7 != 0x40) {
          std::operator+(&java_filename,
                         "Bad java_outer_classname, expecting filename|ClassName found \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &file_generator);
          std::operator+(&package_dir,&java_filename,"\'");
          goto LAB_00250aff;
        }
        Params::set_java_outer_classname
                  (&params,all_files.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                   all_files.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&all_files);
      if (lVar7 != 0x40) {
        std::__cxx11::string::~string((string *)&file_generator);
        std::__cxx11::string::~string((string *)&option_name);
        goto LAB_00250ff6;
      }
    }
LAB_00250b3e:
    std::__cxx11::string::~string((string *)&file_generator);
    std::__cxx11::string::~string((string *)&option_name);
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0x40;
  } while( true );
}

Assistant:

bool JavaNanoGenerator::Generate(const FileDescriptor* file,
                             const string& parameter,
                             GeneratorContext* output_directory,
                             string* error) const {
  vector<pair<string, string> > options;

  ParseGeneratorParameter(parameter, &options);

  // -----------------------------------------------------------------
  // parse generator options

  // Name a file where we will write a list of generated file names, one
  // per line.
  string output_list_file;
  Params params(file->name());

  // Update per file params
  UpdateParamsRecursively(params, file);

  // Replace any existing options with ones from command line
  for (int i = 0; i < options.size(); i++) {
    string option_name = TrimString(options[i].first);
    string option_value = TrimString(options[i].second);
    if (option_name == "output_list_file") {
      output_list_file = option_value;
    } else if (option_name == "java_package") {
        vector<string> parts;
        SplitStringUsing(option_value, "|", &parts);
        if (parts.size() != 2) {
          *error = "Bad java_package, expecting filename|PackageName found '"
            + option_value + "'";
          return false;
        }
        params.set_java_package(parts[0], parts[1]);
    } else if (option_name == "java_outer_classname") {
        vector<string> parts;
        SplitStringUsing(option_value, "|", &parts);
        if (parts.size() != 2) {
          *error = "Bad java_outer_classname, "
                   "expecting filename|ClassName found '"
                   + option_value + "'";
          return false;
        }
        params.set_java_outer_classname(parts[0], parts[1]);
    } else if (option_name == "store_unknown_fields") {
      params.set_store_unknown_fields(option_value == "true");
    } else if (option_name == "java_multiple_files") {
      params.set_override_java_multiple_files(option_value == "true");
    } else if (option_name == "java_nano_generate_has") {
      params.set_generate_has(option_value == "true");
    } else if (option_name == "enum_style") {
      params.set_java_enum_style(option_value == "java");
    } else if (option_name == "optional_field_style") {
      params.set_optional_field_accessors(option_value == "accessors");
      params.set_use_reference_types_for_primitives(option_value == "reftypes"
          || option_value == "reftypes_compat_mode");
      params.set_reftypes_primitive_enums(
          option_value == "reftypes_compat_mode");
      if (option_value == "reftypes_compat_mode") {
        params.set_generate_clear(false);
      }
    } else if (option_name == "generate_equals") {
      params.set_generate_equals(option_value == "true");
    } else if (option_name == "ignore_services") {
      params.set_ignore_services(option_value == "true");
    } else if (option_name == "parcelable_messages") {
      params.set_parcelable_messages(option_value == "true");
    } else if (option_name == "generate_clone") {
      params.set_generate_clone(option_value == "true");
    } else if (option_name == "generate_intdefs") {
      params.set_generate_intdefs(option_value == "true");
    } else if (option_name == "generate_clear") {
      params.set_generate_clear(option_value == "true");
    } else {
      *error = "Ignore unknown javanano generator option: " + option_name;
    }
  }

  // Check illegal parameter combinations
  // Note: the enum-like optional_field_style generator param ensures
  // that we can never have illegal combinations of field styles
  // (e.g. reftypes and accessors can't be on at the same time).
  if (params.generate_has()
      && (params.optional_field_accessors()
          || params.use_reference_types_for_primitives())) {
    error->assign("java_nano_generate_has=true cannot be used in conjunction"
        " with optional_field_style=accessors or optional_field_style=reftypes");
    return false;
  }

  // -----------------------------------------------------------------

  FileGenerator file_generator(file, params);
  if (!file_generator.Validate(error)) {
    return false;
  }

  string package_dir =
    StringReplace(file_generator.java_package(), ".", "/", true);
  if (!package_dir.empty()) package_dir += "/";

  vector<string> all_files;

  if (IsOuterClassNeeded(params, file)) {
    string java_filename = package_dir;
    java_filename += file_generator.classname();
    java_filename += ".java";
    all_files.push_back(java_filename);

    // Generate main java file.
    scoped_ptr<io::ZeroCopyOutputStream> output(
      output_directory->Open(java_filename));
    io::Printer printer(output.get(), '$');
    file_generator.Generate(&printer);
  }

  // Generate sibling files.
  file_generator.GenerateSiblings(package_dir, output_directory, &all_files);

  // Generate output list if requested.
  if (!output_list_file.empty()) {
    // Generate output list.  This is just a simple text file placed in a
    // deterministic location which lists the .java files being generated.
    scoped_ptr<io::ZeroCopyOutputStream> srclist_raw_output(
      output_directory->Open(output_list_file));
    io::Printer srclist_printer(srclist_raw_output.get(), '$');
    for (int i = 0; i < all_files.size(); i++) {
      srclist_printer.Print("$filename$\n", "filename", all_files[i]);
    }
  }

  return true;
}